

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O1

bool google::protobuf::util::SerializeDelimitedToCodedStream
               (MessageLite *message,CodedOutputStream *output)

{
  bool bVar1;
  uint size;
  int iVar2;
  undefined4 extraout_var;
  uint8_t *target;
  undefined4 extraout_var_00;
  byte *ptr;
  ulong uVar3;
  uint uVar4;
  
  size = (*message->_vptr_MessageLite[3])();
  if (CONCAT44(extraout_var,size) < 0x80000000) {
    ptr = output->cur_;
    if ((output->impl_).end_ <= ptr) {
      ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
    }
    output->cur_ = ptr;
    if (CONCAT44(extraout_var,size) < 0x80) {
      uVar3 = (ulong)size;
    }
    else {
      uVar3 = (ulong)size;
      do {
        uVar4 = (uint)uVar3;
        *ptr = (byte)uVar3 | 0x80;
        uVar3 = uVar3 >> 7;
        ptr = ptr + 1;
      } while (0x3fff < uVar4);
    }
    *ptr = (byte)uVar3;
    output->cur_ = ptr + 1;
    target = io::EpsCopyOutputStream::GetDirectBufferForNBytesAndAdvance
                       (&output->impl_,size,&output->cur_);
    if (target == (uint8_t *)0x0) {
      iVar2 = (*message->_vptr_MessageLite[5])(message,output->cur_,output);
      output->cur_ = (uint8_t *)CONCAT44(extraout_var_00,iVar2);
      bVar1 = io::CodedOutputStream::HadError(output);
      if (bVar1) goto LAB_01004c20;
    }
    else {
      MessageLite::SerializeWithCachedSizesToArray(message,target);
    }
    bVar1 = true;
  }
  else {
LAB_01004c20:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SerializeDelimitedToCodedStream(const MessageLite& message,
                                     io::CodedOutputStream* output) {
  // Write the size.
  size_t size = message.ByteSizeLong();
  if (size > INT_MAX) return false;

  output->WriteVarint32(static_cast<uint32_t>(size));

  // Write the content.
  uint8_t* buffer =
      output->GetDirectBufferForNBytesAndAdvance(static_cast<int>(size));
  if (buffer != nullptr) {
    // Optimization: The message fits in one buffer, so use the faster
    // direct-to-array serialization path.
    message.SerializeWithCachedSizesToArray(buffer);
  } else {
    // Slightly-slower path when the message is multiple buffers.
    message.SerializeWithCachedSizes(output);
    if (output->HadError()) return false;
  }

  return true;
}